

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O0

uint NULLC::GetInstructionFromAddress(uintptr_t address)

{
  uint local_1c;
  uint local_18;
  uint index;
  uint upperBound;
  uint lowerBound;
  uintptr_t address_local;
  
  index = 0;
  local_18 = FastVector<unsigned_char_*,_false,_false>::size
                       ((FastVector<unsigned_char_*,_false,_false> *)(currExecutor + 0x14f8));
  local_18 = local_18 - 1;
  local_1c = 0;
  while (index <= local_18) {
    local_1c = index + local_18 >> 1;
    if (address < *(ulong *)(*(long *)(currExecutor + 0x14f8) + (ulong)local_1c * 8)) {
      local_18 = local_1c - 1;
    }
    else {
      if (address <= *(ulong *)(*(long *)(currExecutor + 0x14f8) + (ulong)local_1c * 8)) break;
      index = local_1c + 1;
    }
  }
  if ((local_1c != 0) &&
     (address < *(ulong *)(*(long *)(currExecutor + 0x14f8) + (ulong)local_1c * 8))) {
    local_1c = local_1c - 1;
  }
  return local_1c;
}

Assistant:

unsigned GetInstructionFromAddress(uintptr_t address)
	{
		unsigned lowerBound = 0;
		unsigned upperBound = currExecutor->instAddress.size() - 1;
		unsigned index = 0;

		while(lowerBound <= upperBound)
		{
			index = (lowerBound + upperBound) >> 1;

			if(address < uintptr_t(currExecutor->instAddress.data[index]))
				upperBound = index - 1;
			else if(address > uintptr_t(currExecutor->instAddress.data[index]))
				lowerBound = index + 1;
			else
				break;
		}

		if(index != 0 && address < uintptr_t(currExecutor->instAddress.data[index]))
			index--;

		return index;
	}